

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<ki::dml::Field<short>_> * __thiscall
pybind11::class_<ki::dml::Field<short>>::
def_property_readonly<bool(ki::dml::FieldBase::*)()const,pybind11::return_value_policy>
          (class_<ki::dml::Field<short>> *this,char *name,offset_in_FieldBase_to_subr *fget,
          return_value_policy *extra)

{
  class_<ki::dml::Field<short>_> *pcVar1;
  return_value_policy local_51;
  offset_in_Field<signed_char>_to_subr local_50;
  void *local_40;
  offset_in_FieldBase_to_subr local_38;
  cpp_function local_30;
  return_value_policy *local_28;
  return_value_policy *extra_local;
  offset_in_FieldBase_to_subr *fget_local;
  char *name_local;
  class_<ki::dml::Field<short>_> *this_local;
  
  local_40 = (void *)*fget;
  local_38 = fget[1];
  local_28 = extra;
  extra_local = (return_value_policy *)fget;
  fget_local = (offset_in_FieldBase_to_subr *)name;
  name_local = (char *)this;
  local_50 = _ki__dml__Field<short>___pybind11__method_adaptor<ki::dml::Field<short>,bool,ki::dml::FieldBase>_bool_ki__dml__FieldBase______const__
                       (local_40,local_38);
  cpp_function::cpp_function<bool,ki::dml::Field<short>>(&local_30,local_50);
  local_51 = reference_internal;
  pcVar1 = def_property_readonly<pybind11::return_value_policy,pybind11::return_value_policy>
                     (this,name,&local_30,&local_51,local_28);
  cpp_function::~cpp_function(&local_30);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }